

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O3

_Bool test_permute_cols(void)

{
  uint n;
  ulong uVar1;
  int c;
  uint8_t *memory;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  int *arr;
  _Bool _Var9;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  undefined1 local_48 [8];
  m256v A;
  
  local_50 = auStack_58;
  uVar7 = 0;
  _Var9 = false;
  do {
    n = (&DAT_001046d0)[uVar7];
    arr = (int *)(local_50 + -((ulong)n * 4 + 0xf & 0xfffffffffffffff0));
    arr[-2] = 0x101f80;
    arr[-1] = 0;
    perm_rand(n,arr);
    memory = (uint8_t *)((long)arr - (ulong)(n * n + 0xf & 0xfffffff0));
    memory[-8] = 0xa3;
    memory[-7] = '\x1f';
    memory[-6] = '\x10';
    memory[-5] = '\0';
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)local_48,n,n,memory);
    uVar8 = 1;
    if (1 < (int)n) {
      uVar8 = (ulong)n;
    }
    uVar1 = 0;
    do {
      uVar2 = 0;
      do {
        *(bool *)(uVar2 + A._0_8_ * uVar1 + A.rstride) = uVar1 == uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar8 != uVar2);
      uVar1 = uVar1 + 1;
    } while (uVar1 != uVar8);
    memory[-8] = 0xe4;
    memory[-7] = '\x1f';
    memory[-6] = '\x10';
    memory[-5] = '\0';
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_permute_cols((m256v *)local_48,arr);
    uVar1 = 1;
    if (1 < (int)n) {
      uVar1 = (ulong)n;
    }
    uVar2 = 0;
    pcVar3 = (char *)A.rstride;
    do {
      uVar4 = 0;
      pcVar6 = pcVar3;
      do {
        uVar5 = uVar4;
        if (*pcVar6 != '\0') break;
        uVar4 = uVar4 + 1;
        pcVar6 = pcVar6 + A._0_8_;
        uVar5 = uVar1;
      } while (uVar8 != uVar4);
      if ((int)uVar5 != arr[uVar2]) {
        return _Var9;
      }
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar3 + 1;
    } while (uVar2 != uVar1);
    _Var9 = 5 < uVar7;
    uVar7 = uVar7 + 1;
    if (uVar7 == 7) {
      return true;
    }
  } while( true );
}

Assistant:

static bool test_permute_cols()
{
	const int rowscols[] = { 1, 2, 3, 5, 8, 10, 15 };
	for (int i = 0; i < array_size(rowscols); ++i) {
		const int rc = rowscols[i];

		/* Generate a random permutation */
		int p[rc];
		perm_rand(rc, p);

		/* Generate identity matrix */
		m256v_Def(A, a, rc, rc);
		for (int r = 0; r < rc; ++r) {
			for (int c = 0; c < rc; ++c) {
				m256v_set_el(&A, r, c, r==c);
			}
		}

		/* Apply perm */
		m256v_permute_cols(&A, p);

		/* Check output is as expected */
		for (int c = 0; c < rc; ++c) {
			int j;
			for (j = 0; j < rc; ++j) {
				if (m256v_get_el(&A, j, c))
					break;
			}

			if (j != p[c])
				return false;
		}
	}

	return true;
}